

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::AddTaprootSchnorrSignRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::AddTaprootSchnorrSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  string *psVar3;
  undefined8 uVar4;
  CfdException ex;
  RawTransactionResponse res;
  AddTaprootSchnorrSignRequestStruct request;
  AddTaprootSchnorrSignRequest req;
  undefined1 local_420 [40];
  _Alloc_hider local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Alloc_hider local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  string local_358;
  undefined1 local_338 [16];
  undefined *local_328 [2];
  int local_318;
  _Alloc_hider local_310;
  undefined1 local_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  char local_2e0 [16];
  undefined1 local_2d0 [48];
  undefined1 auStack_2a0 [32];
  _Base_ptr p_Stack_280;
  size_t local_278;
  AddTaprootSchnorrSignRequestStruct local_270;
  AddTaprootSchnorrSignRequest local_158;
  
  AddTaprootSchnorrSignRequest::AddTaprootSchnorrSignRequest(&local_158);
  core::JsonClassBase<cfd::js::api::json::AddTaprootSchnorrSignRequest>::Deserialize
            (&local_158.super_JsonClassBase<cfd::js::api::json::AddTaprootSchnorrSignRequest>,
             (string *)this);
  AddTaprootSchnorrSignRequest::ConvertToStruct(&local_270,&local_158);
  local_420._0_8_ = local_420 + 0x10;
  local_420._8_8_ = 0;
  local_420[0x10] = '\0';
  local_420._32_4_ = 0;
  local_3f8._M_p = (pointer)&local_3e8;
  local_3f0 = 0;
  local_3e8._M_local_buf[0] = '\0';
  local_3d8._M_p = (pointer)&local_3c8;
  local_3d0 = 0;
  local_3c8._M_local_buf[0] = '\0';
  p_Var1 = &local_3b8._M_impl.super__Rb_tree_header;
  local_3b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_388._M_impl.super__Rb_tree_header;
  local_388._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_388._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_3b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_388._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_388._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_270.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f331f:
      uVar4 = std::__throw_bad_function_call();
      RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_338);
      psVar3 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
      if (psVar3 != (string *)&local_3f8) {
        operator_delete(psVar3);
      }
      RawTransactionResponseStruct::~RawTransactionResponseStruct
                ((RawTransactionResponseStruct *)local_420);
      AddTaprootSchnorrSignRequestStruct::~AddTaprootSchnorrSignRequestStruct(&local_270);
      AddTaprootSchnorrSignRequest::~AddTaprootSchnorrSignRequest(&local_158);
      _Unwind_Resume(uVar4);
    }
    (*bitcoin_function->_M_invoker)
              ((RawTransactionResponseStruct *)local_338,(_Any_data *)bitcoin_function,&local_270);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f331f;
    (**(code **)((long)&request_message->field_2 + 8))(local_338,request_message,&local_270);
  }
  std::__cxx11::string::operator=((string *)local_420,(string *)local_338);
  local_420._32_4_ = local_318;
  std::__cxx11::string::operator=((string *)&local_3f8,(string *)&local_310);
  std::__cxx11::string::operator=((string *)&local_3d8,(string *)(local_300 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_3b8);
  if ((_Base_ptr)local_2d0._16_8_ != (_Base_ptr)0x0) {
    local_3b8._M_impl.super__Rb_tree_header._M_header._M_color = local_2d0._8_4_;
    local_3b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2d0._16_8_;
    local_3b8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_2d0._24_8_;
    local_3b8._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_2d0._32_8_;
    *(_Rb_tree_header **)(local_2d0._16_8_ + 8) = p_Var1;
    local_3b8._M_impl.super__Rb_tree_header._M_node_count = local_2d0._40_8_;
    local_2d0._16_8_ = (_Base_ptr)0x0;
    local_2d0._40_8_ = 0;
    local_2d0._24_8_ = (_Base_ptr)(local_2d0 + 8);
    local_2d0._32_8_ = (_Base_ptr)(local_2d0 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_388);
  if ((_Base_ptr)auStack_2a0._16_8_ != (_Base_ptr)0x0) {
    local_388._M_impl.super__Rb_tree_header._M_header._M_color = auStack_2a0._8_4_;
    local_388._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)auStack_2a0._16_8_;
    local_388._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)auStack_2a0._24_8_;
    local_388._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_280;
    *(_Rb_tree_header **)(auStack_2a0._16_8_ + 8) = p_Var2;
    local_388._M_impl.super__Rb_tree_header._M_node_count = local_278;
    auStack_2a0._16_8_ = (_Base_ptr)0x0;
    local_278 = 0;
    auStack_2a0._24_8_ = (_Base_ptr)(auStack_2a0 + 8);
    p_Stack_280 = (_Base_ptr)(auStack_2a0 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_2a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d0);
  if ((char *)local_2f0._M_allocated_capacity != local_2e0) {
    operator_delete((void *)local_2f0._M_allocated_capacity);
  }
  if (local_310._M_p != local_300) {
    operator_delete(local_310._M_p);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_420._32_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_338);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_338,(RawTransactionResponseStruct *)local_420);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
              (&local_358,(JsonClassBase<cfd::js::api::json::RawTransactionResponse> *)local_338);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p);
    }
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_338);
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_338,(InnerErrorResponseStruct *)(local_420 + 0x20));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_358,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_338);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p);
    }
    local_338._0_8_ = &PTR__ErrorResponseBase_00a78a38;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_300);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_338 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_388);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_p != &local_3c8) {
    operator_delete(local_3d8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_p != &local_3e8) {
    operator_delete(local_3f8._M_p);
  }
  if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
    operator_delete((void *)local_420._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_270.ignore_items._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_270.txin.ignore_items._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.annex._M_dataplus._M_p != &local_270.txin.annex.field_2) {
    operator_delete(local_270.txin.annex._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.sighash_type._M_dataplus._M_p != &local_270.txin.sighash_type.field_2) {
    operator_delete(local_270.txin.sighash_type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.signature._M_dataplus._M_p != &local_270.txin.signature.field_2) {
    operator_delete(local_270.txin.signature._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.txid._M_dataplus._M_p != &local_270.txin.txid.field_2) {
    operator_delete(local_270.txin.txid._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.tx._M_dataplus._M_p != &local_270.tx.field_2) {
    operator_delete(local_270.tx._M_dataplus._M_p);
  }
  AddTaprootSchnorrSignRequest::~AddTaprootSchnorrSignRequest(&local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}